

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O3

void __thiscall
duckdb::PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe<duckdb::uhugeint_t>
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *build_sel_vec,
          SelectionVector *probe_sel_vec,idx_t count,idx_t *probe_sel_count)

{
  bool bVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  long lVar5;
  uhugeint_t input_value;
  uhugeint_t max_value;
  uhugeint_t min_value;
  UnifiedVectorFormat vector_data;
  uhugeint_t local_b8;
  uhugeint_t local_a8;
  uhugeint_t local_98;
  uhugeint_t local_88;
  UnifiedVectorFormat local_78;
  
  local_88 = Value::GetValueUnsafe<duckdb::uhugeint_t>(&(this->perfect_join_statistics).build_min);
  local_98 = Value::GetValueUnsafe<duckdb::uhugeint_t>(&(this->perfect_join_statistics).build_max);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(source,count,&local_78);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      uVar4 = 0;
      lVar5 = 0;
      do {
        uVar2 = uVar4;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar2 = (ulong)(local_78.sel)->sel_vector[uVar4];
        }
        local_a8.lower = *(uint64_t *)(local_78.data + uVar2 * 0x10);
        local_a8.upper = *(uint64_t *)((long)(local_78.data + uVar2 * 0x10) + 8);
        bVar1 = uhugeint_t::operator<=(&local_88,&local_a8);
        if ((bVar1) && (bVar1 = uhugeint_t::operator<=(&local_a8,&local_98), bVar1)) {
          local_b8 = uhugeint_t::operator-(&local_a8,&local_88);
          uVar3 = uhugeint_t::operator_cast_to_unsigned_long(&local_b8);
          if ((this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
              super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
              super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar3] == true) {
            build_sel_vec->sel_vector[lVar5] = (sel_t)uVar3;
            probe_sel_vec->sel_vector[lVar5] = (sel_t)uVar4;
            lVar5 = lVar5 + 1;
            *probe_sel_count = *probe_sel_count + 1;
          }
        }
        uVar4 = uVar4 + 1;
      } while (count != uVar4);
    }
  }
  else if (count != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar2 = uVar4;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)(local_78.sel)->sel_vector[uVar4];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar2 >> 6] >>
           (uVar2 & 0x3f) & 1) != 0)) {
        local_a8.lower = *(uint64_t *)(local_78.data + uVar2 * 0x10);
        local_a8.upper = *(uint64_t *)((long)(local_78.data + uVar2 * 0x10) + 8);
        bVar1 = uhugeint_t::operator<=(&local_88,&local_a8);
        if ((bVar1) && (bVar1 = uhugeint_t::operator<=(&local_a8,&local_98), bVar1)) {
          local_b8 = uhugeint_t::operator-(&local_a8,&local_88);
          uVar3 = uhugeint_t::operator_cast_to_unsigned_long(&local_b8);
          if ((this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
              super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
              super__Head_base<0UL,_bool_*,_false>._M_head_impl[uVar3] == true) {
            build_sel_vec->sel_vector[lVar5] = (sel_t)uVar3;
            probe_sel_vec->sel_vector[lVar5] = (sel_t)uVar4;
            lVar5 = lVar5 + 1;
            *probe_sel_count = *probe_sel_count + 1;
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while (count != uVar4);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe(Vector &source, SelectionVector &build_sel_vec,
                                                                SelectionVector &probe_sel_vec, idx_t count,
                                                                idx_t &probe_sel_count) {
	auto min_value = perfect_join_statistics.build_min.GetValueUnsafe<T>();
	auto max_value = perfect_join_statistics.build_max.GetValueUnsafe<T>();

	UnifiedVectorFormat vector_data;
	source.ToUnifiedFormat(count, vector_data);
	auto data = reinterpret_cast<T *>(vector_data.data);
	auto validity_mask = &vector_data.validity;
	// build selection vector for non-dense build
	if (validity_mask->AllValid()) {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	} else {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			if (!validity_mask->RowIsValid(data_idx)) {
				continue;
			}
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	}
}